

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeezenet.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  char *pcVar1;
  int *piVar2;
  _func_int **__first;
  char cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  vector<float,_std::allocator<float>_> cls_scores;
  Extractor ex;
  Net squeezenet;
  Mat local_110;
  Mat local_c8;
  float mean_vals [3];
  Mat m;
  int local_68;
  int local_64;
  uchar *local_60;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&squeezenet,pcVar1,(allocator *)&local_110);
    cv::imread((string *)&m,(int)&squeezenet);
    if ((Allocator **)squeezenet._vptr_Net != &squeezenet.opt.blob_allocator) {
      operator_delete(squeezenet._vptr_Net);
    }
    cVar3 = cv::Mat::empty();
    if (cVar3 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&squeezenet);
      squeezenet.opt.use_vulkan_compute = true;
      iVar4 = ncnn::Net::load_param(&squeezenet,"squeezenet_v1.1.param");
      if ((iVar4 != 0) ||
         (iVar4 = ncnn::Net::load_model(&squeezenet,"squeezenet_v1.1.bin"), iVar4 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_110,local_60,2,local_64,local_68,0xe3,0xe3,(Allocator *)0x0);
      mean_vals[0] = 104.0;
      mean_vals[1] = 117.0;
      mean_vals[2] = 123.0;
      ncnn::Mat::substract_mean_normalize(&local_110,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&local_110);
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8._20_8_ = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      ncnn::Extractor::extract(&ex,"prob",&local_c8,0);
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_c8.w);
      if (0 < (long)local_c8.w) {
        lVar6 = 0;
        do {
          cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[lVar6] = *(float *)((long)local_c8.data + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (local_c8.w != lVar6);
      }
      piVar2 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (local_110.refcount != (int *)0x0) {
        LOCK();
        *local_110.refcount = *local_110.refcount + -1;
        UNLOCK();
        if (*local_110.refcount == 0) {
          if (local_110.allocator == (Allocator *)0x0) {
            if (local_110.data != (void *)0x0) {
              free(local_110.data);
            }
          }
          else {
            (*(local_110.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&squeezenet);
      squeezenet._vptr_Net = (_func_int **)0x0;
      squeezenet.opt.lightmode = false;
      squeezenet.opt._1_3_ = 0;
      squeezenet.opt.num_threads = 0;
      squeezenet.opt.blob_allocator = (Allocator *)0x0;
      uVar7 = (uint)((ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &squeezenet,(long)(int)uVar7);
      __first = squeezenet._vptr_Net;
      if (0 < (int)uVar7) {
        uVar5 = 0;
        do {
          *(float *)(squeezenet._vptr_Net + uVar5) =
               cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5];
          *(int *)((long)squeezenet._vptr_Net + uVar5 * 8 + 4) = (int)uVar5;
          uVar5 = uVar5 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar5);
      }
      __last._M_current = (pair<float,_int> *)(squeezenet._vptr_Net + 3);
      std::
      __heap_select<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (squeezenet._vptr_Net,__last._M_current,squeezenet.opt._0_8_);
      std::
      __sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                ((__normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
                  )__first,__last,
                 (_Iter_comp_iter<std::greater<std::pair<float,_int>_>_> *)&local_110);
      main_cold_2();
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar4 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_squeezenet(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}